

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_emulator.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  
  printf("Command:");
  for (lVar1 = 1; lVar1 < argc; lVar1 = lVar1 + 1) {
    printf(" \"%s\"",argv[lVar1]);
  }
  putchar(10);
  return 0x2a;
}

Assistant:

int main(int argc, char * argv[] )
{
 int ii;

 printf("Command:");
 for(ii = 1; ii < argc; ++ii)
 {
 printf(" \"%s\"", argv[ii]);
 }
 printf("\n");

 return 42;
}